

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_parser.h
# Opt level: O2

string * __thiscall
sentencepiece::PrintProto_abi_cxx11_
          (string *__return_storage_ptr__,sentencepiece *this,NormalizerSpec *message,
          string_view name)

{
  ostream *poVar1;
  ostringstream os;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)name._M_len,(long)message);
  std::operator<<(poVar1," {\n");
  poVar1 = std::operator<<((ostream *)local_1a0,"  ");
  poVar1 = std::operator<<(poVar1,"name");
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)(*(ulong *)(this + 0x30) & 0xfffffffffffffffe));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)local_1a0,"  ");
  poVar1 = std::operator<<(poVar1,"add_dummy_prefix");
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)local_1a0,"  ");
  poVar1 = std::operator<<(poVar1,"remove_extra_whitespaces");
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)local_1a0,"  ");
  poVar1 = std::operator<<(poVar1,"escape_whitespaces");
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)local_1a0,"  ");
  poVar1 = std::operator<<(poVar1,"normalization_rule_tsv");
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)(*(ulong *)(this + 0x40) & 0xfffffffffffffffe));
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string PrintProto(const NormalizerSpec &message,
                              absl::string_view name) {
  std::ostringstream os;

  os << name << " {\n";

  PRINT_PARAM(name);
  PRINT_PARAM(add_dummy_prefix);
  PRINT_PARAM(remove_extra_whitespaces);
  PRINT_PARAM(escape_whitespaces);
  PRINT_PARAM(normalization_rule_tsv);

  os << "}\n";

  return os.str();
}